

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalKdevelopGenerator::CreateNewProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  char *pcVar7;
  pointer pbVar8;
  cmGeneratedFileStream devses;
  cmGeneratedFileStream fout;
  allocator local_4f2;
  allocator local_4f1;
  string local_4f0;
  string *local_4d0;
  string *local_4c8;
  cmGeneratedFileStream local_4c0;
  undefined1 local_278 [584];
  
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    local_4c8 = executable;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c0,
                   projectDir,"/.svn");
    bVar2 = cmsys::SystemTools::FileExists
                      ((char *)local_4c0.super_ofstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c0,
                   projectDir,"/CVS");
    bVar3 = cmsys::SystemTools::FileExists
                      ((char *)local_4c0.super_ofstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream);
    std::__cxx11::string::~string((string *)&local_4c0);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::__cxx11::string::string((string *)&local_4c0,"C",&local_4f2);
    local_4d0 = cmakeFilePattern;
    bVar4 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,(string *)&local_4c0);
    bVar5 = true;
    if (!bVar4) {
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::__cxx11::string::string((string *)&local_4f0,"CXX",&local_4f1);
      bVar5 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
    }
    std::__cxx11::string::~string((string *)&local_4c0);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::__cxx11::string::string((string *)&local_4c0,"Fortran",(allocator *)&local_4f0);
    bVar4 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,(string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::string((string *)&local_4f0,"C++",(allocator *)&local_4c0);
    if (bVar4 && bVar5 == false) {
      std::__cxx11::string::assign((char *)&local_4f0);
    }
    poVar6 = std::operator<<((ostream *)local_278,
                             "<?xml version = \'1.0\'?>\n<kdevelop>\n  <general>\n  <author></author>\n  <email></email>\n  <version>$VERSION$</version>\n  <projectmanagement>KDevCustomProject</projectmanagement>\n  <primarylanguage>"
                            );
    poVar6 = std::operator<<(poVar6,(string *)&local_4f0);
    poVar6 = std::operator<<(poVar6,"</primarylanguage>\n  <ignoreparts/>\n  <projectdirectory>");
    poVar6 = std::operator<<(poVar6,(string *)projectDir);
    std::operator<<(poVar6,"</projectdirectory>\n");
    std::operator<<((ostream *)local_278,"  <absoluteprojectpath>true</absoluteprojectpath>\n");
    std::operator<<((ostream *)local_278,"  <secondaryLanguages>\n");
    if ((bVar5 & bVar4) == 1) {
      std::operator<<((ostream *)local_278,"     <language>Fortran</language>\n");
    }
    if (bVar5 != false) {
      std::operator<<((ostream *)local_278,"     <language>C</language>\n");
    }
    std::operator<<((ostream *)local_278,"  </secondaryLanguages>\n");
    if (bVar3 || bVar2) {
      pcVar7 = "  <versioncontrol>kdevcvsservice</versioncontrol>\n";
      if (bVar2) {
        pcVar7 = "  <versioncontrol>kdevsubversion</versioncontrol>\n";
      }
      std::operator<<((ostream *)local_278,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)local_278,
                             "  </general>\n  <kdevcustomproject>\n    <filelistdirectory>");
    poVar6 = std::operator<<(poVar6,(string *)outputDir);
    poVar6 = std::operator<<(poVar6,"</filelistdirectory>\n    <run>\n      <mainprogram>");
    poVar6 = std::operator<<(poVar6,(string *)local_4c8);
    poVar6 = std::operator<<(poVar6,
                             "</mainprogram>\n      <directoryradio>custom</directoryradio>\n      <customdirectory>"
                            );
    poVar6 = std::operator<<(poVar6,(string *)outputDir);
    std::operator<<(poVar6,
                    "</customdirectory>\n      <programargs></programargs>\n      <terminal>false</terminal>\n      <autocompile>true</autocompile>\n      <envvars/>\n    </run>\n    <build>\n      <buildtool>make</buildtool>\n"
                   );
    poVar6 = std::operator<<((ostream *)local_278,"      <builddir>");
    poVar6 = std::operator<<(poVar6,(string *)outputDir);
    std::operator<<(poVar6,"</builddir>\n");
    poVar6 = std::operator<<((ostream *)local_278,
                             "    </build>\n    <make>\n      <abortonerror>false</abortonerror>\n      <numberofjobs>1</numberofjobs>\n      <dontact>false</dontact>\n      <makebin>"
                            );
    this_00 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators
                ).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->Makefile;
    std::__cxx11::string::string((string *)&local_4c0,"CMAKE_MAKE_PROGRAM",&local_4f2);
    pcVar7 = cmMakefile::GetRequiredDefinition(this_00,(string *)&local_4c0);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,
                    " </makebin>\n      <selectedenvironment>default</selectedenvironment>\n      <environments>\n        <default>\n          <envvar value=\"1\" name=\"VERBOSE\" />\n          <envvar value=\"1\" name=\"CMAKE_NO_VERBOSE\" />\n        </default>\n      </environments>\n    </make>\n"
                   );
    std::__cxx11::string::~string((string *)&local_4c0);
    std::operator<<((ostream *)local_278,"    <blacklist>\n");
    for (pbVar8 = (this->Blacklist).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != (this->Blacklist).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      poVar6 = std::operator<<((ostream *)local_278,"      <path>");
      poVar6 = std::operator<<(poVar6,(string *)pbVar8);
      std::operator<<(poVar6,"</path>\n");
    }
    std::operator<<((ostream *)local_278,"    </blacklist>\n");
    std::operator<<((ostream *)local_278,
                    "  </kdevcustomproject>\n  <kdevfilecreate>\n    <filetypes/>\n    <useglobaltypes>\n      <type ext=\"ui\" />\n      <type ext=\"cpp\" />\n      <type ext=\"h\" />\n    </useglobaltypes>\n  </kdevfilecreate>\n  <kdevdoctreeview>\n    <projectdoc>\n      <userdocDir>html/</userdocDir>\n      <apidocDir>html/</apidocDir>\n    </projectdoc>\n    <ignoreqt_xml/>\n    <ignoredoxygen/>\n    <ignorekdocs/>\n    <ignoretocs/>\n    <ignoredevhelp/>\n  </kdevdoctreeview>\n"
                   );
    if (bVar5 != false) {
      std::operator<<((ostream *)local_278,
                      "  <cppsupportpart>\n    <filetemplates>\n      <interfacesuffix>.h</interfacesuffix>\n      <implementationsuffix>.cpp</implementationsuffix>\n    </filetemplates>\n  </cppsupportpart>\n  <kdevcppsupport>\n    <codecompletion>\n      <includeGlobalFunctions>true</includeGlobalFunctions>\n      <includeTypes>true</includeTypes>\n      <includeEnums>true</includeEnums>\n      <includeTypedefs>false</includeTypedefs>\n      <automaticCodeCompletion>true</automaticCodeCompletion>\n      <automaticArgumentsHint>true</automaticArgumentsHint>\n      <automaticHeaderCompletion>true</automaticHeaderCompletion>\n      <codeCompletionDelay>250</codeCompletionDelay>\n      <argumentsHintDelay>400</argumentsHintDelay>\n      <headerCompletionDelay>250</headerCompletionDelay>\n    </codecompletion>\n    <references/>\n  </kdevcppsupport>\n"
                     );
    }
    if (bVar4) {
      std::operator<<((ostream *)local_278,
                      "  <kdevfortransupport>\n    <ftnchek>\n      <division>false</division>\n      <extern>false</extern>\n      <declare>false</declare>\n      <pure>false</pure>\n      <argumentsall>false</argumentsall>\n      <commonall>false</commonall>\n      <truncationall>false</truncationall>\n      <usageall>false</usageall>\n      <f77all>false</f77all>\n      <portabilityall>false</portabilityall>\n      <argumentsonly/>\n      <commononly/>\n      <truncationonly/>\n      <usageonly/>\n      <f77only/>\n      <portabilityonly/>\n    </ftnchek>\n  </kdevfortransupport>\n"
                     );
    }
    poVar6 = std::operator<<((ostream *)local_278,
                             "  <kdevfileview>\n    <groups>\n      <group pattern=\"");
    poVar6 = std::operator<<(poVar6,(string *)local_4d0);
    std::operator<<(poVar6,"\" name=\"CMake\" />\n");
    if (bVar5 != false) {
      std::operator<<((ostream *)local_278,
                      "      <group pattern=\"*.h;*.hxx;*.hpp\" name=\"Header\" />\n      <group pattern=\"*.c\" name=\"C Sources\" />\n      <group pattern=\"*.cpp;*.C;*.cxx;*.cc\" name=\"C++ Sources\"/>\n"
                     );
    }
    if (bVar4) {
      std::operator<<((ostream *)local_278,
                      "      <group pattern=\"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95\" name=\"Fortran Sources\" />\n"
                     );
    }
    std::operator<<((ostream *)local_278,
                    "      <group pattern=\"*.ui\" name=\"Qt Designer files\" />\n      <hidenonprojectfiles>true</hidenonprojectfiles>\n    </groups>\n    <tree>\n      <hidepatterns>*.o,*.lo,CVS,*~,cmake*</hidepatterns>\n      <hidenonprojectfiles>true</hidenonprojectfiles>\n    </tree>\n  </kdevfileview>\n</kdevelop>\n"
                   );
    if (sessionFilename->_M_string_length != 0) {
      cmGeneratedFileStream::cmGeneratedFileStream
                (&local_4c0,(sessionFilename->_M_dataplus)._M_p,false);
      if (((&local_4c0.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [*(long *)((long)local_4c0.super_ofstream.
                            super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
                     -0x18)] & 5) == 0) {
        poVar6 = std::operator<<((ostream *)&local_4c0,
                                 "<?xml version = \'1.0\' encoding = \'UTF-8\'?>\n<!DOCTYPE KDevPrjSession>\n<KDevPrjSession>\n <DocsAndViews NumberOfDocuments=\"1\" >\n  <Doc0 NumberOfViews=\"1\" URL=\"file://"
                                );
        poVar6 = std::operator<<(poVar6,(string *)fileToOpen);
        std::operator<<(poVar6,
                        "\" >\n   <View0 line=\"0\" Type=\"Source\" />\n  </Doc0>\n </DocsAndViews>\n</KDevPrjSession>\n"
                       );
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&local_4c0);
    }
    std::__cxx11::string::~string((string *)&local_4f0);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator
::CreateNewProjectFile(const std::string& outputDir,
                       const std::string& projectDir,
                       const std::string& filename,
                       const std::string& executable,
                       const std::string& cmakeFilePattern,
                       const std::string& fileToOpen,
                       const std::string& sessionFilename)
{
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  // check for a version control system
  bool hasSvn = cmSystemTools::FileExists((projectDir + "/.svn").c_str());
  bool hasCvs = cmSystemTools::FileExists((projectDir + "/CVS").c_str());

  bool enableCxx = (this->GlobalGenerator->GetLanguageEnabled("C")
                          || this->GlobalGenerator->GetLanguageEnabled("CXX"));
  bool enableFortran = this->GlobalGenerator->GetLanguageEnabled("Fortran");
  std::string primaryLanguage = "C++";
  if (enableFortran && !enableCxx)
    {
    primaryLanguage="Fortran77";
    }

  fout<<"<?xml version = '1.0'?>\n"
        "<kdevelop>\n"
        "  <general>\n"
        "  <author></author>\n"
        "  <email></email>\n"
        "  <version>$VERSION$</version>\n"
        "  <projectmanagement>KDevCustomProject</projectmanagement>\n"
        "  <primarylanguage>" << primaryLanguage << "</primarylanguage>\n"
        "  <ignoreparts/>\n"
        "  <projectdirectory>" << projectDir <<
        "</projectdirectory>\n";   //this one is important
  fout<<"  <absoluteprojectpath>true</absoluteprojectpath>\n"; //and this one

  // setup additional languages
  fout<<"  <secondaryLanguages>\n";
  if (enableFortran && enableCxx)
    {
    fout<<"     <language>Fortran</language>\n";
    }
  if (enableCxx)
    {
    fout<<"     <language>C</language>\n";
    }
  fout<<"  </secondaryLanguages>\n";

  if (hasSvn)
    {
    fout << "  <versioncontrol>kdevsubversion</versioncontrol>\n";
    }
  else if (hasCvs)
    {
    fout << "  <versioncontrol>kdevcvsservice</versioncontrol>\n";
    }

  fout<<"  </general>\n"
        "  <kdevcustomproject>\n"
        "    <filelistdirectory>" << outputDir <<
        "</filelistdirectory>\n"
        "    <run>\n"
        "      <mainprogram>" << executable << "</mainprogram>\n"
        "      <directoryradio>custom</directoryradio>\n"
        "      <customdirectory>"<<outputDir<<"</customdirectory>\n"
        "      <programargs></programargs>\n"
        "      <terminal>false</terminal>\n"
        "      <autocompile>true</autocompile>\n"
        "      <envvars/>\n"
        "    </run>\n"
        "    <build>\n"
        "      <buildtool>make</buildtool>\n"; //this one is important
  fout<<"      <builddir>"<<outputDir<<"</builddir>\n";  //and this one
  fout<<"    </build>\n"
        "    <make>\n"
        "      <abortonerror>false</abortonerror>\n"
        "      <numberofjobs>1</numberofjobs>\n"
        "      <dontact>false</dontact>\n"
        "      <makebin>" << this->GlobalGenerator->GetLocalGenerators()[0]->
            GetMakefile()->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")
            << " </makebin>\n"
        "      <selectedenvironment>default</selectedenvironment>\n"
        "      <environments>\n"
        "        <default>\n"
        "          <envvar value=\"1\" name=\"VERBOSE\" />\n"
        "          <envvar value=\"1\" name=\"CMAKE_NO_VERBOSE\" />\n"
        "        </default>\n"
        "      </environments>\n"
        "    </make>\n";

  fout<<"    <blacklist>\n";
  for(std::vector<std::string>::const_iterator dirIt=this->Blacklist.begin();
      dirIt != this->Blacklist.end();
      ++dirIt)
    {
    fout<<"      <path>" << *dirIt << "</path>\n";
    }
  fout<<"    </blacklist>\n";

  fout<<"  </kdevcustomproject>\n"
        "  <kdevfilecreate>\n"
        "    <filetypes/>\n"
        "    <useglobaltypes>\n"
        "      <type ext=\"ui\" />\n"
        "      <type ext=\"cpp\" />\n"
        "      <type ext=\"h\" />\n"
        "    </useglobaltypes>\n"
        "  </kdevfilecreate>\n"
        "  <kdevdoctreeview>\n"
        "    <projectdoc>\n"
        "      <userdocDir>html/</userdocDir>\n"
        "      <apidocDir>html/</apidocDir>\n"
        "    </projectdoc>\n"
        "    <ignoreqt_xml/>\n"
        "    <ignoredoxygen/>\n"
        "    <ignorekdocs/>\n"
        "    <ignoretocs/>\n"
        "    <ignoredevhelp/>\n"
        "  </kdevdoctreeview>\n";

  if (enableCxx)
    {
    fout<<"  <cppsupportpart>\n"
          "    <filetemplates>\n"
          "      <interfacesuffix>.h</interfacesuffix>\n"
          "      <implementationsuffix>.cpp</implementationsuffix>\n"
          "    </filetemplates>\n"
          "  </cppsupportpart>\n"
          "  <kdevcppsupport>\n"
          "    <codecompletion>\n"
          "      <includeGlobalFunctions>true</includeGlobalFunctions>\n"
          "      <includeTypes>true</includeTypes>\n"
          "      <includeEnums>true</includeEnums>\n"
          "      <includeTypedefs>false</includeTypedefs>\n"
          "      <automaticCodeCompletion>true</automaticCodeCompletion>\n"
          "      <automaticArgumentsHint>true</automaticArgumentsHint>\n"
          "      <automaticHeaderCompletion>true</automaticHeaderCompletion>\n"
          "      <codeCompletionDelay>250</codeCompletionDelay>\n"
          "      <argumentsHintDelay>400</argumentsHintDelay>\n"
          "      <headerCompletionDelay>250</headerCompletionDelay>\n"
          "    </codecompletion>\n"
          "    <references/>\n"
          "  </kdevcppsupport>\n";
    }

  if (enableFortran)
    {
    fout<<"  <kdevfortransupport>\n"
          "    <ftnchek>\n"
          "      <division>false</division>\n"
          "      <extern>false</extern>\n"
          "      <declare>false</declare>\n"
          "      <pure>false</pure>\n"
          "      <argumentsall>false</argumentsall>\n"
          "      <commonall>false</commonall>\n"
          "      <truncationall>false</truncationall>\n"
          "      <usageall>false</usageall>\n"
          "      <f77all>false</f77all>\n"
          "      <portabilityall>false</portabilityall>\n"
          "      <argumentsonly/>\n"
          "      <commononly/>\n"
          "      <truncationonly/>\n"
          "      <usageonly/>\n"
          "      <f77only/>\n"
          "      <portabilityonly/>\n"
          "    </ftnchek>\n"
          "  </kdevfortransupport>\n";
    }

  // set up file groups. maybe this can be used with the CMake SOURCE_GROUP()
  // command
  fout<<"  <kdevfileview>\n"
        "    <groups>\n"
        "      <group pattern=\"" << cmakeFilePattern <<
        "\" name=\"CMake\" />\n";

  if (enableCxx)
    {
    fout<<"      <group pattern=\"*.h;*.hxx;*.hpp\" name=\"Header\" />\n"
          "      <group pattern=\"*.c\" name=\"C Sources\" />\n"
          "      <group pattern=\"*.cpp;*.C;*.cxx;*.cc\" name=\"C++ Sources\""
          "/>\n";
    }

  if (enableFortran)
    {
    fout<<"      <group pattern=\"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;"
          "*.F95\" name=\"Fortran Sources\" />\n";
    }

  fout<<"      <group pattern=\"*.ui\" name=\"Qt Designer files\" />\n"
        "      <hidenonprojectfiles>true</hidenonprojectfiles>\n"
        "    </groups>\n"
        "    <tree>\n"
        "      <hidepatterns>*.o,*.lo,CVS,*~,cmake*</hidepatterns>\n"
        "      <hidenonprojectfiles>true</hidenonprojectfiles>\n"
        "    </tree>\n"
        "  </kdevfileview>\n"
        "</kdevelop>\n";

  if (sessionFilename.empty())
    {
    return;
    }

  // and a session file, so that kdevelop opens a file if it opens the
  // project the first time
  cmGeneratedFileStream devses(sessionFilename.c_str());
  if(!devses)
    {
    return;
    }
  devses<<"<?xml version = '1.0' encoding = \'UTF-8\'?>\n"
          "<!DOCTYPE KDevPrjSession>\n"
          "<KDevPrjSession>\n"
          " <DocsAndViews NumberOfDocuments=\"1\" >\n"
          "  <Doc0 NumberOfViews=\"1\" URL=\"file://" << fileToOpen <<
          "\" >\n"
          "   <View0 line=\"0\" Type=\"Source\" />\n"
          "  </Doc0>\n"
          " </DocsAndViews>\n"
          "</KDevPrjSession>\n";
}